

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O1

void __thiscall asmjit::ZoneHashBase::reset(ZoneHashBase *this,ZoneHeap *heap)

{
  uint uVar1;
  uint32_t newCount;
  Slot *pSVar2;
  Slot *pSVar3;
  Slot *pSVar4;
  uint32_t *puVar5;
  ulong uVar6;
  ZoneHeap *pZVar7;
  size_t in_RDX;
  Slot *pSVar8;
  int iVar9;
  Zone *p;
  ZoneHeap *this_00;
  ZoneHeap *this_01;
  size_t sStack_40;
  ZoneHashBase *pZStack_38;
  
  p = (Zone *)this->_data;
  if (p == (Zone *)this->_embedded) {
LAB_00119cf1:
    this->_heap = heap;
    this->_size = 0;
    this->_bucketsCount = 1;
    this->_bucketsGrow = 1;
    this->_data = this->_embedded;
    this->_embedded[0] = (ZoneHashNode *)0x0;
    return;
  }
  this_00 = this->_heap;
  if (this_00->_zone == (Zone *)0x0) {
    reset();
LAB_00119d1b:
    reset();
  }
  else {
    if (p == (Zone *)0x0) goto LAB_00119d1b;
    uVar1 = this->_bucketsCount;
    if (uVar1 != 0) {
      if (uVar1 < 0x41) {
        if (uVar1 < 0x11) {
          in_RDX = 0x1fffffffff;
          uVar6 = (ulong)uVar1 * 8 + 0x1fffffffff >> 5;
        }
        else {
          in_RDX = 0x3fffffff7f;
          uVar6 = ((ulong)uVar1 * 8 + 0x3fffffff7f >> 6) + 4;
        }
      }
      else {
        uVar6 = 0;
      }
      if (uVar1 < 0x41) {
        p->_ptr = (uint8_t *)this_00->_slots[uVar6 & 0xffffffff];
        this_00->_slots[uVar6 & 0xffffffff] = (Slot *)p;
      }
      else {
        ZoneHeap::_releaseDynamic(this_00,p,in_RDX);
      }
      goto LAB_00119cf1;
    }
  }
  reset();
  this_01 = (ZoneHeap *)this_00->_zone;
  pZStack_38 = this;
  if (this_01 == (ZoneHeap *)0x0) {
    _rehash();
LAB_00119df7:
    _rehash();
LAB_00119dfc:
    _rehash();
  }
  else {
    if (this_01->_zone == (Zone *)0x0) goto LAB_00119df7;
    iVar9 = (int)p;
    pSVar8 = this_00->_slots[2];
    pSVar4 = (Slot *)ZoneHeap::_allocZeroed(this_01,((ulong)p & 0xffffffff) << 3,&sStack_40);
    if (pSVar4 == (Slot *)0x0) {
      return;
    }
    this_01 = (ZoneHeap *)(ulong)*(uint *)(this_00->_slots + 1);
    if (this_01 != (ZoneHeap *)0x0) {
      pZVar7 = (ZoneHeap *)0x0;
      do {
        pSVar3 = pSVar8[(long)pZVar7].next;
        while (pSVar3 != (Slot *)0x0) {
          pSVar2 = pSVar3->next;
          uVar6 = (ulong)*(uint *)&pSVar3[1].next % ((ulong)p & 0xffffffff);
          pSVar3->next = pSVar4[uVar6].next;
          pSVar4[uVar6].next = pSVar3;
          pSVar3 = pSVar2;
        }
        pZVar7 = (ZoneHeap *)((long)&pZVar7->_zone + 1);
      } while (pZVar7 != this_01);
    }
    if (pSVar8 == (Slot *)(this_00->_slots + 3)) {
LAB_00119da6:
      *(int *)(this_00->_slots + 1) = iVar9;
      *(uint *)((long)this_00->_slots + 0xc) = (uint)(iVar9 * 9) / 10;
      this_00->_slots[2] = pSVar4;
      return;
    }
    p = this_00->_zone;
    if (p->_ptr == (uint8_t *)0x0) goto LAB_00119dfc;
    if (pSVar8 != (Slot *)0x0) {
      if (this_01 != (ZoneHeap *)0x0) {
        _rehash();
        goto LAB_00119da6;
      }
      goto LAB_00119e06;
    }
  }
  _rehash();
LAB_00119e06:
  _rehash();
  uVar1 = *(uint *)(this_01->_slots + 1);
  uVar6 = (ulong)*(uint *)&p->_end % (ulong)uVar1;
  pSVar8 = this_01->_slots[2];
  pSVar4 = pSVar8[uVar6].next;
  p->_ptr = (uint8_t *)pSVar4;
  pSVar8[uVar6].next = (Slot *)p;
  pSVar8 = (Slot *)((long)&this_01->_slots[0]->next + 1);
  this_01->_slots[0] = pSVar8;
  if (((Slot *)(ulong)*(uint *)((long)this_01->_slots + 0xc) <= pSVar8) && (pSVar4 != (Slot *)0x0))
  {
    puVar5 = &ZoneHash_getClosestPrime(unsigned_int)::primeTable;
    uVar6 = 0;
    do {
      newCount = *puVar5;
      if (8 < uVar6) break;
      uVar6 = uVar6 + 1;
      puVar5 = puVar5 + 1;
    } while (newCount <= uVar1);
    if (newCount != uVar1) {
      _rehash((ZoneHashBase *)this_01,newCount);
    }
  }
  return;
}

Assistant:

void ZoneHashBase::reset(ZoneHeap* heap) noexcept {
  ZoneHashNode** oldData = _data;
  if (oldData != _embedded)
    _heap->release(oldData, _bucketsCount * sizeof(ZoneHashNode*));

  _heap = heap;
  _size = 0;
  _bucketsCount = 1;
  _bucketsGrow = 1;
  _data = _embedded;
  _embedded[0] = nullptr;
}